

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v6::detail::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  float_writer<char> *pfVar1;
  char *pcVar2;
  bool bVar3;
  char local_59;
  char local_49;
  int local_48;
  int local_44;
  int num_digits_1;
  int num_zeros_3;
  int local_38;
  int num_zeros_2;
  int num_digits;
  char local_2a [2];
  int num_zeros_1;
  int local_24;
  int num_zeros;
  int full_exp;
  char *it_local;
  float_writer<char> *this_local;
  
  local_24 = this->num_digits_ + this->exp_;
  it_local = (char *)this;
  if ((char)*(undefined4 *)&(this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    num_zeros_1 = (this->specs_).precision - this->num_digits_;
    if ((1 < this->num_digits_) ||
       (_num_zeros = (float_writer<char> *)(it + 1),
       (*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
      _num_zeros = (float_writer<char> *)(it + 2);
      it[1] = this->decimal_point_;
    }
    _num_zeros = (float_writer<char> *)
                 copy_str<char,_const_char_*,_char_*,_0>
                           (this->digits_ + 1,this->digits_ + this->num_digits_,(char *)_num_zeros);
    if ((0 < num_zeros_1) && ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
      local_2a[1] = 0x30;
      _num_zeros = (float_writer<char> *)
                   std::fill_n<char*,int,char>((char *)_num_zeros,num_zeros_1,local_2a + 1);
    }
    local_59 = 'E';
    if ((*(uint *)&(this->specs_).field_0x4 & 0x10000) == 0) {
      local_59 = 'e';
    }
    pcVar2 = (char *)((long)_num_zeros + 1);
    *(char *)_num_zeros = local_59;
    _num_zeros = (float_writer<char> *)pcVar2;
    this_local = (float_writer<char> *)write_exponent<char,char*>(local_24 + -1,pcVar2);
  }
  else {
    _num_zeros = (float_writer<char> *)it;
    if (local_24 < this->num_digits_) {
      if (local_24 < 1) {
        *it = '0';
        local_44 = -local_24;
        local_48 = this->num_digits_;
        if (((local_48 == 0) && (-1 < (this->specs_).precision)) &&
           ((this->specs_).precision < local_44)) {
          local_44 = (this->specs_).precision;
        }
        if ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) == 0) {
          while( true ) {
            bVar3 = false;
            if (0 < local_48) {
              bVar3 = this->digits_[local_48 + -1] == '0';
            }
            if (!bVar3) break;
            local_48 = local_48 + -1;
          }
        }
        if (((local_44 != 0) || (local_48 != 0)) ||
           (_num_zeros = (float_writer<char> *)(it + 1),
           (*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
          _num_zeros = (float_writer<char> *)(it + 2);
          *(char *)&((float_writer<char> *)(it + 1))->digits_ = this->decimal_point_;
          local_49 = '0';
          _num_zeros = (float_writer<char> *)
                       std::fill_n<char*,int,char>((char *)_num_zeros,local_44,&local_49);
          _num_zeros = (float_writer<char> *)
                       copy_str<char,_const_char_*,_char_*,_0>
                                 (this->digits_,this->digits_ + local_48,(char *)_num_zeros);
        }
      }
      else {
        pcVar2 = copy_str<char,_const_char_*,_char_*,_0>(this->digits_,this->digits_ + local_24,it);
        if ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) == 0) {
          local_38 = this->num_digits_;
          while( true ) {
            bVar3 = false;
            if (local_24 < local_38) {
              bVar3 = this->digits_[local_38 + -1] == '0';
            }
            if (!bVar3) break;
            local_38 = local_38 + -1;
          }
          _num_zeros = (float_writer<char> *)pcVar2;
          if (local_38 != local_24) {
            _num_zeros = (float_writer<char> *)(pcVar2 + 1);
            *pcVar2 = this->decimal_point_;
          }
          pcVar2 = copy_str<char,_const_char_*,_char_*,_0>
                             (this->digits_ + local_24,this->digits_ + local_38,(char *)_num_zeros);
          return pcVar2;
        }
        _num_zeros = (float_writer<char> *)(pcVar2 + 1);
        *pcVar2 = this->decimal_point_;
        _num_zeros = (float_writer<char> *)
                     copy_str<char,_const_char_*,_char_*,_0>
                               (this->digits_ + local_24,this->digits_ + this->num_digits_,
                                (char *)_num_zeros);
        if (this->num_digits_ < (this->specs_).precision) {
          num_zeros_3 = (this->specs_).precision - this->num_digits_;
          num_digits_1._3_1_ = 0x30;
          _num_zeros = (float_writer<char> *)
                       std::fill_n<char*,int,char>
                                 ((char *)_num_zeros,num_zeros_3,(char *)((long)&num_digits_1 + 3));
        }
      }
    }
    else {
      _num_zeros = (float_writer<char> *)
                   copy_str<char,_const_char_*,_char_*,_0>
                             (this->digits_,this->digits_ + this->num_digits_,it);
      local_2a[0] = '0';
      pfVar1 = (float_writer<char> *)
               std::fill_n<char*,int,char>((char *)_num_zeros,local_24 - this->num_digits_,local_2a)
      ;
      if (((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0) ||
         (_num_zeros = pfVar1, (this->specs_).precision < 0)) {
        _num_zeros = (float_writer<char> *)((long)&pfVar1->digits_ + 1);
        *(char *)&pfVar1->digits_ = this->decimal_point_;
        num_digits = (this->specs_).precision - local_24;
        if (num_digits < 1) {
          if ((char)*(undefined4 *)&(this->specs_).field_0x4 != '\x02') {
            *(char *)_num_zeros = '0';
            _num_zeros = (float_writer<char> *)((long)&pfVar1->digits_ + 2);
          }
          return (char *)_num_zeros;
        }
        num_zeros_2._3_1_ = 0x30;
        _num_zeros = (float_writer<char> *)
                     std::fill_n<char*,int,char>
                               ((char *)_num_zeros,num_digits,(char *)((long)&num_zeros_2 + 3));
      }
    }
    this_local = _num_zeros;
  }
  return (char *)this_local;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }